

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

void __thiscall
QVLABase<QRhiColorAttachment>::append_impl
          (QVLABase<QRhiColorAttachment> *this,qsizetype prealloc,void *array,
          QRhiColorAttachment *abuf,qsizetype increment)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  
  if (0 < increment) {
    lVar10 = (this->super_QVLABaseBase).s;
    lVar1 = lVar10 + increment;
    if ((this->super_QVLABaseBase).a <= lVar1) {
      growBy(this,prealloc,array,increment);
      lVar10 = (this->super_QVLABaseBase).s;
    }
    pvVar4 = (this->super_QVLABaseBase).ptr;
    for (lVar11 = 0; increment * 0x30 - lVar11 != 0; lVar11 = lVar11 + 0x30) {
      puVar2 = (undefined8 *)((long)&abuf->m_texture + lVar11);
      puVar3 = (undefined8 *)((long)pvVar4 + lVar11 + lVar10 * 0x30);
      uVar5 = *puVar2;
      uVar6 = puVar2[1];
      uVar7 = puVar2[2];
      uVar8 = puVar2[3];
      uVar9 = puVar2[5];
      puVar3[4] = puVar2[4];
      puVar3[5] = uVar9;
      puVar3[2] = uVar7;
      puVar3[3] = uVar8;
      *puVar3 = uVar5;
      puVar3[1] = uVar6;
    }
    (this->super_QVLABaseBase).s = lVar1;
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::append_impl(qsizetype prealloc, void *array, const T *abuf, qsizetype increment)
{
    Q_ASSERT(abuf || increment == 0);
    if (increment <= 0)
        return;

    const qsizetype asize = size() + increment;

    if (asize >= capacity())
        growBy(prealloc, array, increment);

    if constexpr (QTypeInfo<T>::isComplex)
        std::uninitialized_copy_n(abuf, increment, end());
    else
        memcpy(static_cast<void *>(end()), static_cast<const void *>(abuf), increment * sizeof(T));

    this->s = asize;
}